

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  byte bVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  byte *pbVar5;
  StringPiece local_48;
  StringPiece local_38;
  
  plVar2 = (long *)src.length_;
  local_48.length_ = (stringpiece_ssize_type)src.ptr_;
  local_48.ptr_ = (char *)this;
  local_38.ptr_ = (char *)this;
  local_38.length_ = local_48.length_;
  if (local_48.length_ < 1) {
    pcVar3 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    pcVar3 = (char *)0x0;
    do {
      bVar1 = StringPiece::operator[](&local_38,lVar4);
      pcVar3 = pcVar3 + (char)CEscapedLength(google::protobuf::StringPiece)::c_escaped_len[bVar1];
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_38.length_);
  }
  if (pcVar3 == (char *)local_48.length_) {
    std::__cxx11::string::append((char *)plVar2,(ulong)local_48.ptr_);
  }
  else {
    lVar4 = plVar2[1];
    std::__cxx11::string::resize((ulong)plVar2,(char)pcVar3 + (char)lVar4);
    if (0 < local_48.length_) {
      pbVar5 = (byte *)(lVar4 + *plVar2);
      lVar4 = 0;
      do {
        bVar1 = StringPiece::operator[](&local_48,lVar4);
        if (bVar1 < 0x22) {
          if (bVar1 == 9) {
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x74;
            goto LAB_002c4bed;
          }
          if (bVar1 == 10) {
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x6e;
            goto LAB_002c4bed;
          }
          if (bVar1 == 0xd) {
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x72;
            goto LAB_002c4bed;
          }
LAB_002c4bcf:
          if ((byte)(bVar1 - 0x20) < 0x5f) {
            *pbVar5 = bVar1;
            pbVar5 = pbVar5 + 1;
          }
          else {
            *pbVar5 = 0x5c;
            pbVar5[1] = bVar1 >> 6 | 0x30;
            pbVar5[2] = bVar1 >> 3 & 7 | 0x30;
            pbVar5[3] = bVar1 & 7 | 0x30;
            pbVar5 = pbVar5 + 4;
          }
        }
        else {
          if (bVar1 == 0x22) {
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x22;
          }
          else if (bVar1 == 0x27) {
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x27;
          }
          else {
            if (bVar1 != 0x5c) goto LAB_002c4bcf;
            pbVar5[0] = 0x5c;
            pbVar5[1] = 0x5c;
          }
LAB_002c4bed:
          pbVar5 = pbVar5 + 2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_48.length_);
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, string* dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}